

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O0

void __thiscall
duckdb::PatasScanState<float>::ScanGroup<unsigned_int,true>
          (PatasScanState<float> *this,uint *values,idx_t group_size)

{
  bool bVar1;
  EXACT_TYPE *in_RDX;
  PatasScanState<float> *in_RSI;
  PatasScanState<float> *in_RDI;
  
  bVar1 = GroupFinished(in_RDI);
  if ((bVar1) && (in_RDI->total_value_count < in_RDI->count)) {
    if (in_RDX == (EXACT_TYPE *)0x400) {
      LoadGroup<true>(in_RSI,(EXACT_TYPE *)0x400);
      in_RDI->total_value_count = (long)in_RDX + in_RDI->total_value_count;
      return;
    }
    LoadGroup<false>(in_RSI,in_RDX);
  }
  PatasGroupState<unsigned_int>::Scan<true>(&in_RDI->group_state,(uint8_t *)in_RSI,(idx_t)in_RDX);
  in_RDI->total_value_count = (long)in_RDX + in_RDI->total_value_count;
  return;
}

Assistant:

void ScanGroup(EXACT_TYPE *values, idx_t group_size) {
		D_ASSERT(group_size <= PatasPrimitives::PATAS_GROUP_SIZE);
		D_ASSERT(group_size <= LeftInGroup());

		if (GroupFinished() && total_value_count < count) {
			if (group_size == PatasPrimitives::PATAS_GROUP_SIZE) {
				LoadGroup<SKIP>(values);
				total_value_count += group_size;
				return;
			} else {
				// Even if SKIP is given, group size is not big enough to be able to fully skip the entire group
				LoadGroup<false>(group_state.values);
			}
		}
		group_state.template Scan<SKIP>((uint8_t *)values, group_size);

		total_value_count += group_size;
	}